

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gss.c
# Opt level: O2

void gss_init(ssh_gss_library *lib,void *dlhandle,int id,char *msg)

{
  t_gss_delete_sec_context p_Var1;
  t_gss_display_status p_Var2;
  t_gss_get_mic p_Var3;
  t_gss_verify_mic p_Var4;
  t_gss_import_name p_Var5;
  t_gss_init_sec_context p_Var6;
  t_gss_release_buffer p_Var7;
  t_gss_release_cred p_Var8;
  t_gss_release_name p_Var9;
  t_gss_acquire_cred p_Var10;
  t_gss_inquire_cred_by_mech p_Var11;
  
  lib->id = id;
  lib->gsslogmsg = msg;
  lib->handle = dlhandle;
  p_Var1 = (t_gss_delete_sec_context)dlsym(dlhandle,"gss_delete_sec_context");
  (lib->u).gssapi.delete_sec_context = p_Var1;
  p_Var2 = (t_gss_display_status)dlsym(dlhandle,"gss_display_status");
  (lib->u).gssapi.display_status = p_Var2;
  p_Var3 = (t_gss_get_mic)dlsym(dlhandle,"gss_get_mic");
  (lib->u).gssapi.get_mic = p_Var3;
  p_Var4 = (t_gss_verify_mic)dlsym(dlhandle,"gss_verify_mic");
  (lib->u).gssapi.verify_mic = p_Var4;
  p_Var5 = (t_gss_import_name)dlsym(dlhandle,"gss_import_name");
  (lib->u).gssapi.import_name = p_Var5;
  p_Var6 = (t_gss_init_sec_context)dlsym(dlhandle,"gss_init_sec_context");
  (lib->u).gssapi.init_sec_context = p_Var6;
  p_Var7 = (t_gss_release_buffer)dlsym(dlhandle,"gss_release_buffer");
  (lib->u).gssapi.release_buffer = p_Var7;
  p_Var8 = (t_gss_release_cred)dlsym(dlhandle,"gss_release_cred");
  (lib->u).gssapi.release_cred = p_Var8;
  p_Var9 = (t_gss_release_name)dlsym(dlhandle,"gss_release_name");
  (lib->u).gssapi.release_name = p_Var9;
  p_Var10 = (t_gss_acquire_cred)dlsym(dlhandle,"gss_acquire_cred");
  (lib->u).gssapi.acquire_cred = p_Var10;
  p_Var11 = (t_gss_inquire_cred_by_mech)dlsym(dlhandle,"gss_inquire_cred_by_mech");
  (lib->u).gssapi.inquire_cred_by_mech = p_Var11;
  ssh_gssapi_bind_fns(lib);
  return;
}

Assistant:

static void gss_init(struct ssh_gss_library *lib, void *dlhandle,
                     int id, const char *msg)
{
    lib->id = id;
    lib->gsslogmsg = msg;
    lib->handle = dlhandle;

#define BIND_GSS_FN(name) \
    lib->u.gssapi.name = (t_gss_##name) dlsym(dlhandle, "gss_" #name)

    BIND_GSS_FN(delete_sec_context);
    BIND_GSS_FN(display_status);
    BIND_GSS_FN(get_mic);
    BIND_GSS_FN(verify_mic);
    BIND_GSS_FN(import_name);
    BIND_GSS_FN(init_sec_context);
    BIND_GSS_FN(release_buffer);
    BIND_GSS_FN(release_cred);
    BIND_GSS_FN(release_name);
    BIND_GSS_FN(acquire_cred);
    BIND_GSS_FN(inquire_cred_by_mech);

#undef BIND_GSS_FN

    ssh_gssapi_bind_fns(lib);
}